

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolordialog.cpp
# Opt level: O3

void __thiscall QtPrivate::QColorShower::rgbEd(QColorShower *this)

{
  QLineEdit *this_00;
  int *piVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  long in_FS_OFFSET;
  QColor local_68;
  QString local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this->rgbOriginal = true;
  uVar2 = QSpinBox::value(&this->rEd->super_QSpinBox);
  uVar3 = QSpinBox::value(&this->gEd->super_QSpinBox);
  uVar4 = QSpinBox::value(&this->bEd->super_QSpinBox);
  iVar5 = currentAlpha(this);
  this->curCol = uVar4 & 0xff | (uVar3 & 0xff) << 8 | (uVar2 & 0xff) << 0x10 | iVar5 << 0x18;
  local_58.d.ptr._6_2_ = 0xaaaa;
  local_58.d.d._0_4_ = 0;
  local_58.d.d._4_2_ = 0xffff;
  local_58.d.d._6_2_ = 0;
  local_58.d.ptr._0_4_ = 0;
  local_58.d.ptr._4_2_ = 0;
  QColor::setRgb((uint)&local_58);
  QColor::getHsv((int *)&local_58,&this->hue,&this->sat,&this->val);
  QColSpinBox::setValue(this->hEd,this->hue);
  QColSpinBox::setValue(this->sEd,this->sat);
  QColSpinBox::setValue(this->vEd,this->val);
  this_00 = this->htEd;
  QColor::QColor(&local_68,this->curCol);
  QColor::name((NameFormat)&local_58);
  QLineEdit::setText(this_00,&local_58);
  piVar1 = (int *)CONCAT26(local_58.d.d._6_2_,CONCAT24(local_58.d.d._4_2_,local_58.d.d._0_4_));
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      QArrayData::deallocate
                ((QArrayData *)
                 CONCAT26(local_58.d.d._6_2_,CONCAT24(local_58.d.d._4_2_,local_58.d.d._0_4_)),2,0x10
                );
    }
  }
  showCurrentColor(this);
  local_68.cspec = this->curCol;
  local_58.d.d._0_4_ = 0;
  local_58.d.d._4_2_ = 0;
  local_58.d.d._6_2_ = 0;
  local_58.d.ptr._0_4_ = SUB84(&local_68,0);
  local_58.d.ptr._4_2_ = (undefined2)((ulong)&local_68 >> 0x20);
  local_58.d.ptr._6_2_ = (undefined2)((ulong)&local_68 >> 0x30);
  QMetaObject::activate((QObject *)this,&staticMetaObject,0,(void **)&local_58);
  updateQColor(this);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QColorShower::rgbEd()
{
    rgbOriginal = true;
    curCol = qRgba(rEd->value(), gEd->value(), bEd->value(), currentAlpha());

    rgb2hsv(currentColor(), hue, sat, val);

    hEd->setValue(hue);
    sEd->setValue(sat);
    vEd->setValue(val);

    htEd->setText(QColor(curCol).name());

    showCurrentColor();
    emit newCol(currentColor());
    updateQColor();
}